

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_attr_chlist_entry_t * __thiscall
Imf_3_4::Context::findChannel(Context *this,int partidx,char *name)

{
  int iVar1;
  exr_attr_chlist_t *peVar2;
  size_t sVar3;
  exr_attr_chlist_entry_t *peVar4;
  char *in_RDX;
  exr_attr_chlist_entry_t *curc;
  int i;
  int32_t len;
  exr_attr_chlist_t *cl;
  int in_stack_0000019c;
  Context *in_stack_000001a0;
  int local_30;
  
  peVar2 = channels(in_stack_000001a0,in_stack_0000019c);
  sVar3 = strlen(in_RDX);
  local_30 = 0;
  while( true ) {
    if (peVar2->num_channels <= local_30) {
      return (exr_attr_chlist_entry_t *)0x0;
    }
    peVar4 = peVar2->entries + local_30;
    if (((peVar4->name).length == (int)sVar3) &&
       (iVar1 = memcmp(in_RDX,(peVar4->name).str,(long)(int)sVar3), iVar1 == 0)) break;
    local_30 = local_30 + 1;
  }
  return peVar4;
}

Assistant:

const exr_attr_chlist_entry_t* Context::findChannel (int partidx, const char* name) const
{
    const exr_attr_chlist_t* cl  = channels (partidx);
    int32_t                  len = strlen (name);

    for (int i = 0; i < cl->num_channels; ++i)
    {
        const exr_attr_chlist_entry_t* curc = cl->entries + i;
        if (curc->name.length == len && 0 == memcmp (name, curc->name.str, len))
        {
            return curc;
        }
    }
    return nullptr;
}